

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tzx.cpp
# Opt level: O2

void TZX_AppendStandardBlock(path *fname,byte *buf,aint buflen,word pauseAfterMs,byte sync)

{
  FILE *__stream;
  ulong uVar1;
  ulong uVar2;
  string local_50;
  
  __stream = (FILE *)SJ_fopen(fname,"a+b");
  if (__stream == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_50,fname);
    Error("[TZX] Error opening file for append",local_50._M_dataplus._M_p,FATAL);
    std::__cxx11::string::~string((string *)&local_50);
  }
  fputc(0x10,__stream);
  fputc(pauseAfterMs & 0xff,__stream);
  fputc((uint)(pauseAfterMs >> 8),__stream);
  fputc(buflen + 2U & 0xff,__stream);
  fputc((int)(buflen + 2U) >> 8,__stream);
  fputc((uint)sync,__stream);
  fwrite(buf,1,(long)buflen,__stream);
  uVar1 = 0;
  uVar2 = (ulong)(uint)buflen;
  if (buflen < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    sync = sync ^ buf[uVar1];
  }
  fputc((uint)sync,__stream);
  fclose(__stream);
  return;
}

Assistant:

void TZX_AppendStandardBlock(const std::filesystem::path & fname,
							 const byte* buf, const aint buflen, word pauseAfterMs, byte sync) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "a+b")) {
		Error("[TZX] Error opening file for append", fname.string().c_str(), FATAL);
	}

	const aint totalDataLen = buflen + 2; // + sync byte + checksum

	fputc(TZXBlockId::Standard, ff); // block id

	fputc(pauseAfterMs & 0xFF, ff); // block header
	fputc(pauseAfterMs >> 8, ff);
	fputc(totalDataLen & 0xFF, ff);
	fputc(totalDataLen >> 8, ff);

	fputc(sync, ff); // sync pattern
	fwrite(buf, 1, buflen, ff); // payload
	byte check = sync;
	for (aint i = 0; i < buflen; ++i) check ^= buf[i];
	fputc(check, ff); // checksum
	fclose(ff);
}